

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::anon_unknown_35::InMemoryFile::Impl::ensureCapacity(Impl *this,size_t capacity)

{
  Exception *pEVar1;
  size_t sVar2;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> size;
  uchar *puVar3;
  uchar *__src;
  size_t sVar4;
  Array<unsigned_char> *other;
  unsigned_long local_50;
  undefined1 local_48 [8];
  Array<unsigned_char> newBytes;
  Fault local_20;
  Fault f;
  size_t capacity_local;
  Impl *this_local;
  
  f.exception = (Exception *)capacity;
  pEVar1 = (Exception *)Array<unsigned_char>::size(&this->bytes);
  if (pEVar1 < f.exception) {
    if (this->mmapCount != 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[79]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x390,FAILED,"mmapCount == 0",
                 "\"InMemoryFile cannot resize the file backing store while memory mappings exist.\""
                 ,(char (*) [79])
                  "InMemoryFile cannot resize the file backing store while memory mappings exist.");
      _::Debug::Fault::fatal(&local_20);
    }
    sVar2 = Array<unsigned_char>::size(&this->bytes);
    local_50 = sVar2 * 2;
    size = max<unsigned_long&,unsigned_long>((unsigned_long *)&f,&local_50);
    heapArray<unsigned_char>((Array<unsigned_char> *)local_48,size);
    puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_48);
    __src = Array<unsigned_char>::begin(&this->bytes);
    memcpy(puVar3,__src,this->size);
    puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)local_48);
    sVar2 = this->size;
    sVar4 = Array<unsigned_char>::size((Array<unsigned_char> *)local_48);
    memset(puVar3 + sVar2,0,sVar4 - this->size);
    other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)local_48);
    Array<unsigned_char>::operator=(&this->bytes,other);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_48);
  }
  return;
}

Assistant:

void ensureCapacity(size_t capacity) {
      if (bytes.size() < capacity) {
        KJ_ASSERT(mmapCount == 0,
            "InMemoryFile cannot resize the file backing store while memory mappings exist.");

        auto newBytes = heapArray<byte>(kj::max(capacity, bytes.size() * 2));
        memcpy(newBytes.begin(), bytes.begin(), size);
        memset(newBytes.begin() + size, 0, newBytes.size() - size);
        bytes = kj::mv(newBytes);
      }
    }